

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

int __thiscall ON_Brep::GetMesh(ON_Brep *this,mesh_type mt,ON_SimpleArray<const_ON_Mesh_*> *meshes)

{
  ON_SimpleArray<const_ON_Mesh_*> *pOVar1;
  int iVar2;
  ON_BrepFace *this_00;
  ON_Mesh *local_38;
  ON_Mesh *mesh;
  int local_28;
  int null_count;
  int fi;
  int fcnt;
  ON_SimpleArray<const_ON_Mesh_*> *meshes_local;
  ON_Brep *pOStack_10;
  mesh_type mt_local;
  ON_Brep *this_local;
  
  _fi = meshes;
  meshes_local._4_4_ = mt;
  pOStack_10 = this;
  null_count = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
  pOVar1 = _fi;
  mesh._4_4_ = 0;
  iVar2 = ON_SimpleArray<const_ON_Mesh_*>::Count(_fi);
  ON_SimpleArray<const_ON_Mesh_*>::Reserve(pOVar1,(long)(iVar2 + null_count));
  for (local_28 = 0; pOVar1 = _fi, local_28 < null_count; local_28 = local_28 + 1) {
    this_00 = ON_ClassArray<ON_BrepFace>::operator[]
                        ((ON_ClassArray<ON_BrepFace> *)&this->m_F,local_28);
    local_38 = ON_BrepFace::Mesh(this_00,meshes_local._4_4_);
    ON_SimpleArray<const_ON_Mesh_*>::Append(_fi,&local_38);
    if (local_38 == (ON_Mesh *)0x0) {
      mesh._4_4_ = mesh._4_4_ + 1;
    }
  }
  if (mesh._4_4_ == null_count) {
    iVar2 = ON_SimpleArray<const_ON_Mesh_*>::Count(_fi);
    ON_SimpleArray<const_ON_Mesh_*>::SetCount(pOVar1,iVar2 - null_count);
    null_count = 0;
  }
  return null_count;
}

Assistant:

int ON_Brep::GetMesh( ON::mesh_type mt, ON_SimpleArray<const ON_Mesh*>& meshes ) const
{
  int fcnt = m_F.Count();
  int fi;
  int null_count = 0;
  meshes.Reserve( meshes.Count() + fcnt );
  for ( fi = 0; fi < fcnt; fi++ )
  {
    const ON_Mesh* mesh = m_F[fi].Mesh(mt);
    meshes.Append( mesh );
    if ( !mesh )
    {
      // If some meshes are missing, we have to put
      // a null in the return array so the face-to-mesh
      // correspondence is preserved.
      null_count++;
    }
  }
  if ( null_count == fcnt )
  {
    // If ALL the meshes are missing, return 0.
    meshes.SetCount(meshes.Count()-fcnt);
    fcnt = 0;
  }
  return fcnt;
}